

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O3

TextClassifier * __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::New(TextClassifier *this,Arena *arena)

{
  TextClassifier *this_00;
  
  this_00 = (TextClassifier *)operator_new(0x38);
  TextClassifier(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CoreMLModels::TextClassifier>(arena,this_00)
    ;
  }
  return this_00;
}

Assistant:

TextClassifier* TextClassifier::New(::google::protobuf::Arena* arena) const {
  TextClassifier* n = new TextClassifier;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}